

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O3

int Gia_ManSolveSat(Gia_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  Aig_Man_t *pMan;
  Vec_Int_t *pVVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  char *pcVar9;
  int level;
  char *format;
  Gia_Obj_t *pGVar10;
  int iVar11;
  long lVar12;
  
  pMan = Gia_ManToAig(p,0);
  iVar2 = Fra_FraigSat(pMan,10000000,0,0,0,0,1,1,0,0);
  if (iVar2 == 0) {
    pvVar1 = pMan->pData;
    *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
    iVar8 = p->nRegs;
    pVVar3 = p->vCis;
    iVar11 = pVVar3->nSize;
    if (iVar8 < iVar11) {
      lVar5 = 0;
      do {
        if (iVar11 <= lVar5) goto LAB_00679390;
        lVar12 = (long)pVVar3->pArray[lVar5];
        if ((lVar12 < 0) || (p->nObjs <= pVVar3->pArray[lVar5])) goto LAB_00679371;
        pVVar3 = (Vec_Int_t *)p->pObjs;
        if (pVVar3 == (Vec_Int_t *)0x0) break;
        *(ulong *)(&pVVar3->nCap + lVar12 * 3) =
             *(ulong *)(&pVVar3->nCap + lVar12 * 3) & 0xffffffffbfffffff |
             (ulong)((*(uint *)((long)pvVar1 + lVar5 * 4) & 1) << 0x1e);
        lVar5 = lVar5 + 1;
        iVar8 = p->nRegs;
        pVVar3 = p->vCis;
        iVar11 = pVVar3->nSize;
      } while (lVar5 < iVar11 - iVar8);
    }
    level = (int)pVVar3;
    iVar11 = p->nObjs;
    if (0 < iVar11) {
      lVar5 = 0;
      lVar12 = 0;
      do {
        pGVar10 = p->pObjs;
        if (pGVar10 == (Gia_Obj_t *)0x0) break;
        uVar6 = *(ulong *)(&pGVar10->field_0x0 + lVar5);
        if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
          *(ulong *)(&pGVar10->field_0x0 + lVar5) =
               uVar6 & 0xffffffff3fffffff |
               (ulong)((((uint)(uVar6 >> 0x3d) ^
                        *(uint *)((long)pGVar10 +
                                 (ulong)((uint)(uVar6 >> 0x1e) & 0x7ffffffc) * -3 + lVar5) >> 0x1e)
                        & ((uint)(uVar6 >> 0x1d) & 7 ^
                          *(uint *)((long)pGVar10 +
                                   (ulong)(uint)((int)(uVar6 & 0x1fffffff) << 2) * -3 + lVar5) >>
                          0x1e) & 1) << 0x1e);
          iVar11 = p->nObjs;
        }
        lVar12 = lVar12 + 1;
        pGVar10 = (Gia_Obj_t *)(long)iVar11;
        lVar5 = lVar5 + 0xc;
      } while (lVar12 < (long)pGVar10);
      level = (int)pGVar10;
      iVar8 = p->nRegs;
    }
    pVVar3 = p->vCos;
    uVar4 = pVVar3->nSize;
    uVar6 = (ulong)uVar4;
    format = (char *)(ulong)(uVar4 - iVar8);
    if (uVar4 - iVar8 == 0 || (int)uVar4 < iVar8) {
      iVar8 = 0;
    }
    else {
      lVar5 = 0;
      do {
        if ((int)uVar6 <= lVar5) goto LAB_00679390;
        iVar8 = pVVar3->pArray[lVar5];
        if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00679371;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar10 = p->pObjs + iVar8;
        uVar4 = (uint)*(ulong *)pGVar10;
        *(ulong *)pGVar10 =
             *(ulong *)pGVar10 & 0xffffffffbfffffff |
             (ulong)((uVar4 * 2 ^ *(uint *)(pGVar10 + -(ulong)(uVar4 & 0x1fffffff))) & 0x40000000);
        lVar5 = lVar5 + 1;
        pVVar3 = p->vCos;
        uVar6 = (ulong)pVVar3->nSize;
        format = (char *)(uVar6 - (long)p->nRegs);
      } while (lVar5 < (long)format);
      level = (int)format;
      format = (char *)((ulong)format & 0xffffffff);
      pcVar9 = (char *)0x0;
      if (0 < level) {
        pcVar7 = (char *)(uVar6 & 0xffffffff);
        if ((int)uVar6 < 1) {
          pcVar7 = pcVar9;
        }
        do {
          if (pcVar7 == pcVar9) {
LAB_00679390:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar8 = pVVar3->pArray[(long)pcVar9];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_00679371:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if ((p->pObjs == (Gia_Obj_t *)0x0) || ((p->pObjs[iVar8].field_0x3 & 0x40) == 0))
          goto LAB_0067934b;
          pcVar9 = pcVar9 + 1;
        } while (format != pcVar9);
        goto LAB_0067935c;
      }
LAB_0067934b:
      iVar8 = (int)pcVar9;
    }
    if (iVar8 != (int)format) {
      Abc_Print(level,format);
    }
  }
LAB_0067935c:
  Aig_ManStop(pMan);
  return iVar2;
}

Assistant:

int Gia_ManSolveSat( Gia_Man_t * p )
{
//    extern int Fra_FraigSat( Aig_Man_t * pMan, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int fFlipBits, int fAndOuts, int fNewSolver, int fVerbose );
    Aig_Man_t * pNew;
    int RetValue;//, clk = Abc_Clock();
    pNew = Gia_ManToAig( p, 0 );
    RetValue = Fra_FraigSat( pNew, 10000000, 0, 0, 0, 0, 1, 1, 0, 0 );
    if ( RetValue == 0 )
    {
        Gia_Obj_t * pObj;
        int i, * pInit = (int *)pNew->pData;
        Gia_ManConst0(p)->fMark0 = 0;
        Gia_ManForEachPi( p, pObj, i )
            pObj->fMark0 = pInit[i];
        Gia_ManForEachAnd( p, pObj, i )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachPo( p, pObj, i )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachPo( p, pObj, i )
            if ( pObj->fMark0 != 1 )
                break;
        if ( i != Gia_ManPoNum(p) )
            Abc_Print( 1, "Counter-example verification has failed.  " );
//        else
//            Abc_Print( 1, "Counter-example verification succeeded.  " );
    }
/*
    else if ( RetValue == 1 )
        Abc_Print( 1, "The SAT problem is unsatisfiable.  " );
    else if ( RetValue == -1 )
        Abc_Print( 1, "The SAT problem is undecided.  " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
*/
    Aig_ManStop( pNew );
    return RetValue;
}